

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::StandardPageSizesTestCase::StandardPageSizesTestCase
          (StandardPageSizesTestCase *this,Context *context)

{
  Context *context_local;
  StandardPageSizesTestCase *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"StandardPageSizesTestCase",
             "Verifies if values returned by GetInternalFormativ query matches Standard Virtual Page Sizes"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__StandardPageSizesTestCase_0324d250;
  std::vector<int,_std::allocator<int>_>::vector(&this->mSupportedTargets);
  std::
  map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
  ::map(&this->mStandardVirtualPageSizesTable);
  return;
}

Assistant:

StandardPageSizesTestCase::StandardPageSizesTestCase(deqp::Context& context)
	: TestCase(context, "StandardPageSizesTestCase",
			   "Verifies if values returned by GetInternalFormativ query matches Standard Virtual Page Sizes")
{
	/* Left blank intentionally */
}